

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSLSocket.cpp
# Opt level: O2

int __thiscall blc::network::SSLSocket::open(SSLSocket *this,char *__file,int __oflag,...)

{
  ushort uVar1;
  bool bVar2;
  int iVar3;
  in_addr_t iVar4;
  undefined7 extraout_var;
  hostent *phVar5;
  int *piVar6;
  SSL_METHOD *meth;
  SSL_CTX *ctx;
  SSL *s;
  exception *peVar7;
  char *pcVar8;
  allocator<char> local_1c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  sockaddr_in addr;
  string local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  bVar2 = std::operator==(&this->_address,"");
  iVar3 = (int)CONCAT71(extraout_var,bVar2);
  if ((bVar2) || (this->_port == 0)) {
    peVar7 = (exception *)__cxa_allocate_exception(0x78);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"non set connection",(allocator<char> *)&local_1c8);
    error::exception::exception(peVar7,&local_38);
    __cxa_throw(peVar7,&error::exception::typeinfo,error::exception::~exception);
  }
  if (this->_opened == false) {
    iVar3 = socket(this->_type,(this->_block ^ 1) << 0xb | this->_mode,0);
    *(int *)&(this->super_Socket).field_0x44 = iVar3;
    if (iVar3 == -1) {
      peVar7 = (exception *)__cxa_allocate_exception(0x78);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_178,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/BHC-IT[P]blc/src/SSLSocket.cpp"
                 ,&local_1c9);
      std::operator+(&local_158,&local_178,": ");
      std::operator+(&local_138,&local_158,"void blc::network::SSLSocket::open()");
      std::operator+(&local_118,&local_138,": ");
      std::__cxx11::to_string(&local_198,0xbe);
      std::operator+(&local_f8,&local_118,&local_198);
      std::operator+(&local_1c8,&local_f8,": ");
      piVar6 = __errno_location();
      pcVar8 = strerror(*piVar6);
      std::operator+(&local_58,&local_1c8,pcVar8);
      error::exception::exception(peVar7,&local_58);
      __cxa_throw(peVar7,&error::exception::typeinfo,error::exception::~exception);
    }
    addr.sin_family = 2;
    uVar1 = (ushort)this->_port;
    addr.sin_port = uVar1 << 8 | uVar1 >> 8;
    addr.sin_addr.s_addr = inet_addr((this->_address)._M_dataplus._M_p);
    iVar4 = inet_addr((this->_address)._M_dataplus._M_p);
    if (iVar4 == 0xffffffff) {
      phVar5 = gethostbyname((this->_address)._M_dataplus._M_p);
      if (phVar5 == (hostent *)0x0) {
        peVar7 = (exception *)__cxa_allocate_exception(0x78);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_178,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/BHC-IT[P]blc/src/SSLSocket.cpp"
                   ,&local_1c9);
        std::operator+(&local_158,&local_178,": ");
        std::operator+(&local_138,&local_158,"void blc::network::SSLSocket::open()");
        std::operator+(&local_118,&local_138,": ");
        std::__cxx11::to_string(&local_198,0xca);
        std::operator+(&local_f8,&local_118,&local_198);
        std::operator+(&local_1c8,&local_f8,": ");
        piVar6 = __errno_location();
        pcVar8 = strerror(*piVar6);
        std::operator+(&local_78,&local_1c8,pcVar8);
        error::exception::exception(peVar7,&local_78);
        __cxa_throw(peVar7,&error::exception::typeinfo,error::exception::~exception);
      }
      if ((in_addr_t *)*phVar5->h_addr_list != (in_addr_t *)0x0) {
        addr.sin_addr.s_addr = *(in_addr_t *)*phVar5->h_addr_list;
      }
    }
    iVar3 = connect(*(int *)&(this->super_Socket).field_0x44,(sockaddr *)&addr,0x10);
    if (iVar3 < 0) {
      piVar6 = __errno_location();
      if (*piVar6 != 0x73) {
        peVar7 = (exception *)__cxa_allocate_exception(0x78);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_178,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/BHC-IT[P]blc/src/SSLSocket.cpp"
                   ,&local_1c9);
        std::operator+(&local_158,&local_178,": ");
        std::operator+(&local_138,&local_158,"void blc::network::SSLSocket::open()");
        std::operator+(&local_118,&local_138,": ");
        std::__cxx11::to_string(&local_198,0xd2);
        std::operator+(&local_f8,&local_118,&local_198);
        std::operator+(&local_1c8,&local_f8,": ");
        pcVar8 = strerror(*piVar6);
        std::operator+(&local_98,&local_1c8,pcVar8);
        error::exception::exception(peVar7,&local_98);
        __cxa_throw(peVar7,&error::exception::typeinfo,error::exception::~exception);
      }
    }
    this->_opened = true;
    meth = (SSL_METHOD *)TLS_client_method();
    ctx = SSL_CTX_new(meth);
    s = SSL_new(ctx);
    this->_ssl = (SSL *)s;
    if (s == (SSL *)0x0) {
      log_ssl();
      peVar7 = (exception *)__cxa_allocate_exception(0x78);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"Error creating SSL",(allocator<char> *)&local_1c8);
      error::exception::exception(peVar7,&local_b8);
      __cxa_throw(peVar7,&error::exception::typeinfo,error::exception::~exception);
    }
    SSL_get_fd(s);
    SSL_set_fd((SSL *)this->_ssl,*(int *)&(this->super_Socket).field_0x44);
    iVar3 = SSL_connect((SSL *)this->_ssl);
    if (iVar3 < 1) {
      log_ssl();
      peVar7 = (exception *)__cxa_allocate_exception(0x78);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,"Error creating SSL connection",(allocator<char> *)&local_1c8);
      error::exception::exception(peVar7,&local_d8);
      __cxa_throw(peVar7,&error::exception::typeinfo,error::exception::~exception);
    }
    do {
      iVar3 = (*(this->super_Socket).super_stream._vptr_stream[5])(this);
    } while ((char)iVar3 == '\0');
  }
  return iVar3;
}

Assistant:

void blc::network::SSLSocket::open() {
	struct sockaddr_in addr;

	if (this->_address == "" || this->_port == 0)
		throw blc::error::exception("non set connection");
	else if (this->_opened == true)
		return;
	this->_socket = ::socket(this->_type, this->_mode | (SOCK_NONBLOCK * (1 - this->_block)), 0);
	if (this->_socket == -1)
		throw blc::error::exception(assertError(strerror(errno)));
	#ifdef __WIN32
		u_long mode = !this->_block;
		ioctlsocket(this->_socket, FIONBIO, &mode);
	#endif
	addr.sin_family = AF_INET;
	addr.sin_port = htons(this->_port);
	addr.sin_addr.s_addr = inet_addr(this->_address.c_str());
	if(inet_addr(this->_address.c_str()) == INADDR_NONE) {
		struct hostent *he;
		struct in_addr **addr_list;
		if ( (he = gethostbyname( this->_address.c_str() ) ) == NULL)
			throw blc::error::exception(assertError(strerror(errno)));
		addr_list = (struct in_addr **) he->h_addr_list;
		for(int i = 0; addr_list[i] != NULL; i++) {
			addr.sin_addr = *addr_list[i];
			break;
		}
	}
	if (connect(this->_socket, (struct sockaddr *)&addr, sizeof(addr)) < 0 && errno != EINPROGRESS)
		throw blc::error::exception(assertError(strerror(errno)));
	this->_opened = true;
	const SSL_METHOD *meth = SSLv23_client_method();
	SSL_CTX *ctx = SSL_CTX_new (meth);
	this->_ssl = SSL_new (ctx);
	if (!this->_ssl) {
		log_ssl();
		throw blc::error::exception("Error creating SSL");
	}
	SSL_get_fd(this->_ssl);
	SSL_set_fd(this->_ssl, this->_socket);
	if (SSL_connect(this->_ssl) <= 0) {
		log_ssl();
		throw blc::error::exception("Error creating SSL connection");
	}
	while (this->writable() == false) continue;
}